

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

double __thiscall PhyloTree::getBranchLengthSum(PhyloTree *this)

{
  bool bVar1;
  reference pdVar2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDI;
  double dVar3;
  double attrib;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  PhyloTreeEdge *edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  double sum;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  pointer *local_38;
  reference local_30;
  PhyloTreeEdge *local_28;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_20;
  pointer *local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = &in_RDI[1].super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_20._M_current =
       (PhyloTreeEdge *)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_RDI);
  local_28 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator*(&local_20);
    dVar3 = PhyloTreeEdge::getLength(local_30);
    local_10 = dVar3 + local_10;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_20);
  }
  local_38 = &in_RDI[3].super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_40._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffffb0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_RDI);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_40);
    in_stack_ffffffffffffffb0 =
         (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
          *)*pdVar2;
    local_10 = (double)in_stack_ffffffffffffffb0 + local_10;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_40);
  }
  return local_10;
}

Assistant:

double PhyloTree::getBranchLengthSum() {
    double sum = 0;
    for (auto &edge : edges) {
        sum += edge.getLength();
    }

    for (auto attrib : leafEdgeLengths) {
        sum += attrib;
    }

    return sum;
}